

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O0

Var Js::GlobalObject::EntryEscape(RecyclableObject *function,CallInfo callInfo,...)

{
  char16 c;
  code *pcVar1;
  bool bVar2;
  int n;
  CallFlags e;
  charcount_t cVar3;
  ScriptContext *pSVar4;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar5;
  JavascriptLibrary *pJVar6;
  Var aValue;
  char16 *pcVar7;
  char16 *pcVar8;
  char local_98 [8];
  char _rgchHex [17];
  char16 *pchLim;
  char16 *pchSrc;
  JavascriptString *pJStack_60;
  char16 chw;
  JavascriptString *src;
  CompoundString *bs;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar4 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar4);
  pSVar4 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar4,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x563,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  bs = (CompoundString *)RecyclableObject::GetScriptContext(function);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar2 = operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x566,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (((uint)scriptContext & 0xffffff) == 1 || ((ulong)scriptContext & 0xffffff) == 0) {
    pJVar6 = ScriptContext::GetLibrary((ScriptContext *)bs);
    callInfo_local = (CallInfo)JavascriptLibrary::GetUndefinedDisplayString(pJVar6);
  }
  else {
    src = (JavascriptString *)0x0;
    EnterPinnedScope(&stack0xffffffffffffffa0);
    aValue = Arguments::operator[]((Arguments *)&scriptContext,1);
    pJStack_60 = JavascriptConversion::ToString(aValue,(ScriptContext *)bs);
    cVar3 = JavascriptString::GetLength(pJStack_60);
    pJVar6 = ScriptContext::GetLibrary((ScriptContext *)bs);
    src = (JavascriptString *)CompoundString::NewWithCharCapacity(cVar3,pJVar6);
    builtin_strncpy(local_98,"01234567",8);
    builtin_strncpy(_rgchHex,"89ABCDEF",9);
    pcVar7 = JavascriptString::GetString(pJStack_60);
    cVar3 = JavascriptString::GetLength(pJStack_60);
    pchLim = pcVar7;
    while (pchLim < pcVar7 + cVar3) {
      pcVar8 = pchLim + 1;
      c = *pchLim;
      pchLim = pcVar8;
      if ((c & 0xff00U) == 0) {
        if (((uint)_grfbitEscape[(int)(uint)(ushort)c >> 3] & 1 << ((byte)c & 7)) == 0) {
          CompoundString::AppendChars((CompoundString *)src,c);
        }
        else {
          CompoundString::AppendChars((CompoundString *)src,L'%');
          CompoundString::AppendChars
                    ((CompoundString *)src,(short)_rgchHex[(long)((int)(uint)(ushort)c >> 4) + -8]);
          CompoundString::AppendChars
                    ((CompoundString *)src,(short)_rgchHex[(long)(int)((ushort)c & 0xf) + -8]);
        }
      }
      else {
        CompoundString::AppendChars<3u>((CompoundString *)src,(char16 (*) [3])0x198967a,true);
        CompoundString::AppendChars
                  ((CompoundString *)src,(short)_rgchHex[(long)((int)(uint)(ushort)c >> 0xc) + -8]);
        CompoundString::AppendChars
                  ((CompoundString *)src,
                   (short)_rgchHex[(long)(int)((int)(uint)(ushort)c >> 8 & 0xf) + -8]);
        CompoundString::AppendChars
                  ((CompoundString *)src,
                   (short)_rgchHex[(long)(int)((int)(uint)(ushort)c >> 4 & 0xf) + -8]);
        CompoundString::AppendChars
                  ((CompoundString *)src,(short)_rgchHex[(long)(int)((ushort)c & 0xf) + -8]);
      }
    }
    LeavePinnedScope();
    callInfo_local = (CallInfo)src;
  }
  return (Var)callInfo_local;
}

Assistant:

Var GlobalObject::EntryEscape(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count <= 1)
        {
            return scriptContext->GetLibrary()->GetUndefinedDisplayString();
        }

        CompoundString * bs = nullptr;
        ENTER_PINNED_SCOPE(JavascriptString, src);
        src = JavascriptConversion::ToString(args[1], scriptContext);
        bs = CompoundString::NewWithCharCapacity(src->GetLength(), scriptContext->GetLibrary());

        char16 chw;
        char16 * pchSrc;
        char16 * pchLim;

        const char _rgchHex[] = "0123456789ABCDEF";

        pchSrc = const_cast<char16 *>(src->GetString());
        pchLim = pchSrc + src->GetLength();
        while (pchSrc < pchLim)
        {
            chw = *pchSrc++;

            if (0 != (chw & 0xFF00))
            {
                bs->AppendChars(_u("%u"));
                bs->AppendChars(static_cast<char16>(_rgchHex[(chw >> 12) & 0x0F]));
                bs->AppendChars(static_cast<char16>(_rgchHex[(chw >> 8) & 0x0F]));
                bs->AppendChars(static_cast<char16>(_rgchHex[(chw >> 4) & 0x0F]));
                bs->AppendChars(static_cast<char16>(_rgchHex[chw & 0x0F]));
            }
            else if (_grfbitEscape[chw >> 3] & (1 << (chw & 7)))
            {
                // Escape the byte.
                bs->AppendChars(_u('%'));
                bs->AppendChars(static_cast<char16>(_rgchHex[chw >> 4]));
                bs->AppendChars(static_cast<char16>(_rgchHex[chw & 0x0F]));
            }
            else
            {
                bs->AppendChars(chw);
            }
        }
        LEAVE_PINNED_SCOPE();   // src

        return bs;
    }